

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O3

dropt_char * dropt_get_error_message(dropt_context *context)

{
  dropt_error error;
  dropt_char *optionArgument;
  char *pcVar1;
  dropt_char *pdVar2;
  char *pcVar3;
  
  if (context != (dropt_context *)0x0) {
    error = (context->errorDetails).err;
    if (error == 0) {
      pcVar3 = "";
    }
    else {
      pcVar1 = (context->errorDetails).message;
      if (pcVar1 == (char *)0x0) {
        pdVar2 = (context->errorDetails).optionName;
        optionArgument = (context->errorDetails).optionArgument;
        if (context->errorHandler == (dropt_error_handler_func)0x0) {
          pcVar1 = dropt_default_error_handler(error,pdVar2,optionArgument);
        }
        else {
          pcVar1 = (*context->errorHandler)(error,pdVar2,optionArgument,context->errorHandlerData);
        }
        (context->errorDetails).message = pcVar1;
      }
      pcVar3 = "Unknown error";
      if (pcVar1 != (char *)0x0) {
        pcVar3 = pcVar1;
      }
    }
    return pcVar3;
  }
  dropt_get_error_message_cold_1();
  switch((ulong)context & 0xffffffff) {
  case 0:
    return (dropt_char *)0x0;
  default:
    pcVar3 = "Unknown error handling option %s";
    break;
  case 2:
    pdVar2 = dropt_strdup("Invalid option configuration");
    return pdVar2;
  case 3:
    pdVar2 = dropt_strdup("Insufficient memory");
    return pdVar2;
  case 4:
    pcVar3 = "Invalid option: %s";
    break;
  case 5:
    pcVar3 = "Value required after option %s";
    break;
  case 6:
    pcVar3 = "Invalid value for option %s%s%s";
    goto LAB_001026cb;
  case 7:
    pcVar3 = "Value too large for option %s%s%s";
    goto LAB_001026cb;
  case 8:
    pcVar3 = "Value too small for option %s%s%s";
LAB_001026cb:
    pdVar2 = dropt_asprintf(pcVar3);
    return pdVar2;
  }
  pdVar2 = dropt_asprintf(pcVar3);
  return pdVar2;
}

Assistant:

const dropt_char*
dropt_get_error_message(dropt_context* context)
{
    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        return DROPT_TEXT_LITERAL("");
    }

    if (context->errorDetails.err == dropt_error_none)
    {
        return DROPT_TEXT_LITERAL("");
    }

    if (context->errorDetails.message == NULL)
    {
        if (context->errorHandler != NULL)
        {
            context->errorDetails.message
                = context->errorHandler(context->errorDetails.err,
                                        context->errorDetails.optionName,
                                        context->errorDetails.optionArgument,
                                        context->errorHandlerData);
        }
        else
        {
#ifndef DROPT_NO_STRING_BUFFERS
            context->errorDetails.message
                = dropt_default_error_handler(context->errorDetails.err,
                                              context->errorDetails.optionName,
                                              context->errorDetails.optionArgument);
#endif
        }
    }

    return (context->errorDetails.message == NULL)
           ? DROPT_TEXT_LITERAL("Unknown error")
           : context->errorDetails.message;
}